

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

Channel * __thiscall
ear::Layout::channelWithName(Channel *__return_storage_ptr__,Layout *this,string *name)

{
  bool bVar1;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  _Var2;
  long lVar3;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  __it;
  long lVar4;
  string *local_40;
  Channel *local_38;
  
  __it._M_current =
       (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)local_38 - (long)__it._M_current;
  local_40 = name;
  for (lVar3 = lVar4 / 0x90 >> 2; _Var2._M_current = __it._M_current, 0 < lVar3; lVar3 = lVar3 + -1)
  {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it);
    if (bVar1) goto LAB_0013d3d0;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it._M_current + 1);
    _Var2._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_0013d3d0;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it._M_current + 2);
    _Var2._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_0013d3d0;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it._M_current + 3);
    _Var2._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_0013d3d0;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x240;
  }
  lVar4 = lVar4 / 0x90;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var2._M_current = local_38;
      if ((lVar4 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::$_0>::
                  operator()((_Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::__0>
                              *)&local_40,__it), _Var2._M_current = __it._M_current, bVar1))
      goto LAB_0013d3d0;
      _Var2._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::__0>
                        *)&local_40,_Var2);
    if (bVar1) goto LAB_0013d3d0;
    __it._M_current = _Var2._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::$_0>::
          operator()((_Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::__0>
                      *)&local_40,__it);
  _Var2._M_current = local_38;
  if (bVar1) {
    _Var2._M_current = __it._M_current;
  }
LAB_0013d3d0:
  Channel::Channel(__return_storage_ptr__,_Var2._M_current);
  return __return_storage_ptr__;
}

Assistant:

Channel Layout::channelWithName(const std::string& name) const {
    auto it = std::find_if(
        _channels.begin(), _channels.end(),
        [&name](const Channel c) -> bool { return c.name() == name; });
    return *it;
  }